

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall Debugger::DoAction(Debugger *this,DebugAction action)

{
  shared_ptr<HookState> local_90;
  shared_ptr<HookState> local_80;
  shared_ptr<HookState> local_70;
  shared_ptr<HookState> local_60;
  shared_ptr<HookState> local_50 [2];
  shared_ptr<HookState> local_30;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  DebugAction action_local;
  Debugger *this_local;
  
  lock._M_device._4_4_ = action;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->hookStateMtx);
  switch(lock._M_device._4_4_) {
  case Break:
    std::shared_ptr<HookState>::shared_ptr<HookStateBreak,void>
              (&local_30,&this->manager->stateBreak);
    SetHookState(this,&local_30);
    std::shared_ptr<HookState>::~shared_ptr(&local_30);
    break;
  case Continue:
    std::shared_ptr<HookState>::shared_ptr<HookStateContinue,void>
              (local_50,&this->manager->stateContinue);
    SetHookState(this,local_50);
    std::shared_ptr<HookState>::~shared_ptr(local_50);
    break;
  case StepOver:
    std::shared_ptr<HookState>::shared_ptr<HookStateStepOver,void>
              (&local_60,&this->manager->stateStepOver);
    SetHookState(this,&local_60);
    std::shared_ptr<HookState>::~shared_ptr(&local_60);
    break;
  case StepIn:
    std::shared_ptr<HookState>::shared_ptr<HookStateStepIn,void>
              (&local_70,&this->manager->stateStepIn);
    SetHookState(this,&local_70);
    std::shared_ptr<HookState>::~shared_ptr(&local_70);
    break;
  case StepOut:
    std::shared_ptr<HookState>::shared_ptr<HookStateStepOut,void>
              (&local_90,&this->manager->stateStepOut);
    SetHookState(this,&local_90);
    std::shared_ptr<HookState>::~shared_ptr(&local_90);
    break;
  case Stop:
    std::shared_ptr<HookState>::shared_ptr<HookStateStop,void>(&local_80,&this->manager->stateStop);
    SetHookState(this,&local_80);
    std::shared_ptr<HookState>::~shared_ptr(&local_80);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void Debugger::DoAction(DebugAction action) {
	// 锁加到这里
	std::lock_guard<std::mutex> lock(hookStateMtx);
	switch (action) {
		case DebugAction::Break:
			SetHookState(manager->stateBreak);
			break;
		case DebugAction::Continue:
			SetHookState(manager->stateContinue);
			break;
		case DebugAction::StepOver:
			SetHookState(manager->stateStepOver);
			break;
		case DebugAction::StepIn:
			SetHookState(manager->stateStepIn);
			break;
		case DebugAction::Stop:
			SetHookState(manager->stateStop);
			break;
		case DebugAction::StepOut:
			SetHookState(manager->stateStepOut);
			break;
		default:
			break;
	}
}